

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O0

void __thiscall
DisconnectedBlockTransactions::~DisconnectedBlockTransactions(DisconnectedBlockTransactions *this)

{
  long lVar1;
  bool bVar2;
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::__cxx11::
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_RDI);
  if (!bVar2) {
    __assert_fail("queuedTx.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                  ,0x1a,"DisconnectedBlockTransactions::~DisconnectedBlockTransactions()");
  }
  bVar2 = std::
          unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
          ::empty(in_RDI);
  if (!bVar2) {
    __assert_fail("iters_by_txid.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                  ,0x1b,"DisconnectedBlockTransactions::~DisconnectedBlockTransactions()");
  }
  if ((in_RDI->_M_h).
      super__Hashtable_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      .
      super__Hash_code_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
      .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0 != 0) {
    __assert_fail("cachedInnerUsage == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                  ,0x1c,"DisconnectedBlockTransactions::~DisconnectedBlockTransactions()");
  }
  std::
  unordered_map<uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>_>
  ::~unordered_map(in_RDI);
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  ~list((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DisconnectedBlockTransactions::~DisconnectedBlockTransactions()
{
    assert(queuedTx.empty());
    assert(iters_by_txid.empty());
    assert(cachedInnerUsage == 0);
}